

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O3

UINT8 device_start_okim6258(OKIM6258_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  int iVar2;
  int iVar3;
  DEV_DATA DVar4;
  UINT8 UVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  double dVar11;
  
  DVar4.chipInf = calloc(1,0x68);
  if ((DEV_DATA *)DVar4.chipInf == (DEV_DATA *)0x0) {
    UVar5 = 0xff;
  }
  else {
    UVar1 = (cfg->_genCfg).clock;
    *(UINT32 *)((long)DVar4.chipInf + 0x4c) = UVar1;
    uVar6 = cfg->divider & 3;
    *(char *)((long)DVar4.chipInf + 0x2c) = (char)uVar6;
    UVar5 = '\x04';
    if (cfg->adpcmBits != '\0') {
      UVar5 = cfg->adpcmBits;
    }
    *(UINT8 *)((long)DVar4.chipInf + 0x2d) = UVar5;
    if (tables_computed == '\0') {
      piVar9 = diff_lookup;
      lVar10 = 0;
      do {
        dVar11 = pow(1.1,(double)(int)lVar10);
        dVar11 = floor(dVar11 * 16.0);
        iVar3 = (int)dVar11;
        iVar7 = iVar3 + 7;
        iVar2 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar7 = iVar3;
          iVar2 = iVar3;
        }
        lVar8 = 0;
        do {
          *(int *)((long)piVar9 + lVar8) =
               ((&DAT_00181fec)[lVar8] * (iVar2 >> 2) + (&DAT_00181fe8)[lVar8] * (iVar3 / 2) +
               (&DAT_00181fe4)[lVar8] * iVar3 + (iVar7 >> 3)) * (&compute_tables_nbl2bit)[lVar8];
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x40);
        lVar10 = lVar10 + 1;
        piVar9 = piVar9 + 0x10;
      } while (lVar10 != 0x31);
      tables_computed = '\x01';
    }
    *(UINT32 *)((long)DVar4.chipInf + 0x24) = UVar1;
    *(char *)((long)DVar4.chipInf + 0x46) = (char)UVar1;
    *(char *)((long)DVar4.chipInf + 0x47) = (char)(UVar1 >> 8);
    *(char *)&((DEV_DATA *)((long)DVar4.chipInf + 0x48))->chipInf = (char)(UVar1 >> 0x10);
    *(char *)((long)DVar4.chipInf + 0x49) = (char)(UVar1 >> 0x18);
    uVar6 = dividers[uVar6];
    *(uint *)&((DEV_DATA *)((long)DVar4.chipInf + 0x28))->chipInf = uVar6;
    UVar5 = '\n';
    if (cfg->outputBits != '\0') {
      UVar5 = cfg->outputBits;
    }
    *(UINT8 *)((long)DVar4.chipInf + 0x31) = UVar5;
    *(short *)((long)DVar4.chipInf + 0x32) = (short)(-1 << (0xc - UVar5 & 0x1f));
    *(undefined2 *)((long)DVar4.chipInf + 0x34) = 0xfffe;
    *(void **)DVar4.chipInf = DVar4.chipInf;
    UVar5 = '\0';
    retDevInf->dataPtr = (DEV_DATA *)DVar4.chipInf;
    retDevInf->sampleRate = ((uVar6 >> 1) + UVar1) / uVar6;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar5;
}

Assistant:

static UINT8 device_start_okim6258(const OKIM6258_CFG* cfg, DEV_INFO* retDevInf)
{
	okim6258_state *info;

	info = (okim6258_state *)calloc(1, sizeof(okim6258_state));
	if (info == NULL)
		return 0xFF;

	info->initial_clock = cfg->_genCfg.clock;
	info->start_divider = cfg->divider & 0x03;
	info->adpcm_type = cfg->adpcmBits;
	if (! info->adpcm_type)
		info->adpcm_type = 4;

	compute_tables();

	info->master_clock = info->initial_clock;
	WriteLE32(info->clock_buffer, info->master_clock);
	info->divider = dividers[info->start_divider];
	info->SmpRateFunc = NULL;

	info->output_bits = cfg->outputBits;
	if (! info->output_bits)
		info->output_bits = 10;
	// D/A precision is 10-bits but 12-bit data can be output serially to an external DAC
	info->output_mask = ~((1 << (12 - info->output_bits)) - 1);

	info->signal = -2;
	info->step = 0;

	okim6258_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, get_vclk(info), &devDef);
	return 0x00;
}